

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

char * mfgets(char *s,int size,mFILE *mf)

{
  size_t sVar1;
  long lVar2;
  int iVar3;
  char *local_30;
  int local_24;
  int i;
  mFILE *mf_local;
  int size_local;
  char *s_local;
  
  if (mf == m_channel[0]) {
    init_mstdin();
  }
  *s = '\0';
  local_24 = 0;
  do {
    if (size + -1 <= local_24) break;
    if (mf->size <= mf->offset) {
      mf->eof = 1;
      break;
    }
    sVar1 = mf->offset;
    mf->offset = sVar1 + 1;
    s[local_24] = mf->data[sVar1];
    iVar3 = local_24 + 1;
    lVar2 = (long)local_24;
    local_24 = iVar3;
  } while (s[lVar2] != '\n');
  s[local_24] = '\0';
  local_30 = s;
  if (local_24 == 0) {
    local_30 = (char *)0x0;
  }
  return local_30;
}

Assistant:

char *mfgets(char *s, int size, mFILE *mf) {
    int i;

    if (mf == m_channel[0]) init_mstdin();
    *s = 0;
    for (i = 0; i < size-1;) {
	if (mf->offset < mf->size) {
	    s[i] = mf->data[mf->offset++];
	    if (s[i++] == '\n')
		break;
	} else {
	    mf->eof = 1;
	    break;
	}
    }

    s[i] = 0;
    return i ? s : NULL;
}